

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_resource.cpp
# Opt level: O1

void __thiscall std::pmr::test_resource::~test_resource(test_resource *this)

{
  Link *pLVar1;
  test_resource_list *ptVar2;
  size_t sVar3;
  Link *pLVar4;
  
  *(undefined ***)this = &PTR__test_resource_00106cb0;
  if ((this->m_verbose_flag_).super___atomic_base<int>._M_i != 0) {
    print(this);
  }
  pLVar4 = this->m_list_->d_head_p;
  while (pLVar4 != (Link *)0x0) {
    pLVar1 = pLVar4->m_next_;
    (**(code **)(*(long *)this->m_pmr_ + 0x18))(this->m_pmr_,pLVar4,0x18,8);
    pLVar4 = pLVar1;
  }
  ptVar2 = this->m_list_;
  ptVar2->d_head_p = (Link *)0x0;
  ptVar2->d_tail_p = (Link *)0x0;
  (**(code **)(*(long *)this->m_pmr_ + 0x18))(this->m_pmr_,ptVar2,0x10,8);
  if (((this->m_quiet_flag_).super___atomic_base<int>._M_i == 0) &&
     (((this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i != 0 ||
      ((this->m_blocks_in_use_).super___atomic_base<long_long>._M_i != 0)))) {
    printf("MEMORY_LEAK");
    sVar3 = (this->m_name_)._M_len;
    if (sVar3 != 0) {
      printf(" from %.*s",sVar3,(this->m_name_)._M_str);
    }
    printf(":\n  Number of blocks in use = %lld\n   Number of bytes in use = %lld\n",
           (this->m_blocks_in_use_).super___atomic_base<long_long>._M_i,
           (this->m_bytes_in_use_).super___atomic_base<unsigned_long>._M_i);
    if ((this->m_no_abort_flag_).super___atomic_base<int>._M_i == 0) {
      abort();
    }
  }
  std::pmr::memory_resource::~memory_resource(&this->super_memory_resource);
  return;
}

Assistant:

test_resource::~test_resource()
{
    if (is_verbose()) {
        print();
    }

    Link *link_p = m_list_->d_head_p;
    while (link_p) {
        Link *linkToFree = link_p;
        link_p = link_p->m_next_;
        m_pmr_->deallocate(linkToFree, sizeof(Link), alignof(Link));
    }
    m_list_->d_head_p = nullptr;
    m_list_->d_tail_p = nullptr;
    m_pmr_->deallocate(m_list_,
                       sizeof(test_resource_list),
                       alignof(test_resource_list));

    if (!is_quiet()) {
        if (bytes_in_use() || blocks_in_use()) {
            printf("MEMORY_LEAK");
            if (!m_name_.empty()) {
                printf(" from %.*s",
                       static_cast<int>(m_name_.length()), m_name_.data());
            }
            printf(":\n  Number of blocks in use = %lld\n"
                   "   Number of bytes in use = %lld\n",
                   blocks_in_use(), bytes_in_use());

            if (!is_no_abort()) {
                std::abort();                                          // ABORT
            }
        }
    }
}